

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

int Abc_AigCleanup(Abc_Aig_t *pMan)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  Abc_Obj_t *pNode;
  int local_24;
  int nNodesOld;
  int i;
  Abc_Obj_t *pAnd;
  Vec_Ptr_t *vDangles;
  Abc_Aig_t *pMan_local;
  
  iVar1 = pMan->nEntries;
  p = Vec_PtrAlloc(100);
  for (local_24 = 0; local_24 < pMan->nBins; local_24 = local_24 + 1) {
    for (_nNodesOld = pMan->pBins[local_24]; _nNodesOld != (Abc_Obj_t *)0x0;
        _nNodesOld = _nNodesOld->pNext) {
      iVar2 = Abc_ObjFanoutNum(_nNodesOld);
      if (iVar2 == 0) {
        Vec_PtrPush(p,_nNodesOld);
      }
    }
  }
  for (local_24 = 0; iVar2 = Vec_PtrSize(p), local_24 < iVar2; local_24 = local_24 + 1) {
    pNode = (Abc_Obj_t *)Vec_PtrEntry(p,local_24);
    Abc_AigDeleteNode(pMan,pNode);
  }
  Vec_PtrFree(p);
  return iVar1 - pMan->nEntries;
}

Assistant:

int Abc_AigCleanup( Abc_Aig_t * pMan )
{
    Vec_Ptr_t * vDangles;
    Abc_Obj_t * pAnd;
    int i, nNodesOld;
//    printf( "Strash0 = %d.  Strash1 = %d.  Strash100 = %d.  StrashM = %d.\n", 
//        pMan->nStrash0, pMan->nStrash1, pMan->nStrash5, pMan->nStrash2 );
    nNodesOld = pMan->nEntries;
    // collect the AND nodes that do not fanout
    vDangles = Vec_PtrAlloc( 100 );
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntry( pMan->pBins[i], pAnd )
            if ( Abc_ObjFanoutNum(pAnd) == 0 )
                Vec_PtrPush( vDangles, pAnd );
    // process the dangling nodes and their MFFCs
    Vec_PtrForEachEntry( Abc_Obj_t *, vDangles, pAnd, i )
        Abc_AigDeleteNode( pMan, pAnd );
    Vec_PtrFree( vDangles );
    return nNodesOld - pMan->nEntries;
}